

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v11::detail::vformat_to(buffer<char> *buf,string_view fmt,format_args args,locale_ref loc)

{
  char *pcVar1;
  named_arg_info<char> *this;
  basic_string_view<char> fmt_00;
  format_arg arg;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_48;
  type local_38;
  buffer<char> *local_30;
  format_handler<char> *local_28;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_20;
  void *local_18;
  default_arg_formatter<char> local_8;
  
  local_20 = args.field_1;
  local_28 = (format_handler<char> *)args.desc_;
  pcVar1 = (char *)fmt.size_;
  this = (named_arg_info<char> *)fmt.data_;
  if ((pcVar1 != (char *)0x2) || (*(short *)&this->name != 0x7d7b)) {
    local_38 = 0;
    fmt_00.size_ = (size_t)&local_48;
    fmt_00.data_ = pcVar1;
    local_48.named_args.data = this;
    local_48.string.size = (size_t)pcVar1;
    local_30 = buf;
    local_18 = loc.locale_;
    parse_format_string<char,fmt::v11::detail::format_handler<char>>((detail *)this,fmt_00,local_28)
    ;
    return;
  }
  local_38 = none_type;
  if ((long)local_28 < 0) {
    if ((int)(type)args.desc_ < 1) goto LAB_001dc50c;
    local_38 = (local_20.args_)->type_;
  }
  else {
    local_38 = (type)args.desc_ & custom_type;
    if (((undefined1  [16])args & (undefined1  [16])0xf) == (undefined1  [16])0x0)
    goto LAB_001dc50c;
  }
  local_48.long_long_value = ((local_20.values_)->field_0).long_long_value;
  local_48.string.size = ((local_20.values_)->field_0).string.size;
LAB_001dc50c:
  local_8.out.container = (basic_appender<char>)(basic_appender<char>)buf;
  basic_format_arg<fmt::v11::context>::visit<fmt::v11::detail::default_arg_formatter<char>>
            ((basic_format_arg<fmt::v11::context> *)&local_48.string,&local_8);
  return;
}

Assistant:

FMT_FUNC void vformat_to(buffer<char>& buf, string_view fmt, format_args args,
                         locale_ref loc) {
  auto out = appender(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}"))
    return args.get(0).visit(default_arg_formatter<char>{out});
  parse_format_string(
      fmt, format_handler<char>{parse_context<char>(fmt), {out, args, loc}});
}